

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall MovingParam::moveTo(MovingParam *this,double tval,double _startTS)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = this->defMax;
  if (tval <= this->defMax) {
    dVar5 = tval;
  }
  uVar3 = -(ulong)(tval < this->defMin);
  dVar5 = (double)(uVar3 & (ulong)this->defMin | ~uVar3 & (ulong)dVar5);
  bVar1 = dequal(dVar5,this->val);
  if (bVar1) {
    dVar4 = this->defMax;
    if (dVar5 <= this->defMax) {
      dVar4 = dVar5;
    }
    uVar3 = -(ulong)(dVar5 < this->defMin);
    this->val = (double)(uVar3 & (ulong)this->defMin | ~uVar3 & (ulong)dVar4);
    this->timeFrom = NAN;
    this->timeTo = NAN;
    this->valTo = NAN;
    this->valDist = NAN;
    dVar5 = NAN;
    lVar2 = 0x28;
  }
  else {
    bVar1 = dequal(this->valTo,dVar5);
    if (bVar1) {
      return;
    }
    this->valFrom = this->val;
    this->valTo = dVar5;
    dVar5 = dVar5 - this->val;
    this->valDist = dVar5;
    this->bIncrease = 0.0 < dVar5;
    dVar4 = (double)((ulong)currCycle.simTime & -(ulong)NAN(_startTS) |
                    ~-(ulong)NAN(_startTS) & (ulong)_startTS);
    this->timeFrom = dVar4;
    dVar5 = fma(ABS(dVar5 / this->defDist),this->defDuration,dVar4);
    lVar2 = 0x48;
  }
  *(double *)((long)&this->defMin + lVar2) = dVar5;
  return;
}

Assistant:

void MovingParam::moveTo ( double tval, double _startTS )
{
    // Normalize between limits
    tval = std::clamp<double>(tval, defMin, defMax);
    
    // current value equals target already
    if (dequal(tval, val))
        SetVal(tval);                     // just set the target value bit-euqal, no moving
    // we shall move to a (new) given target:
    // calc required duration by using defining parameters
    else if ( !dequal(valTo, tval) ) {
        // set origin and desired target value
        valFrom = val;
        valTo = tval;
        valDist = valTo - valFrom;
        bIncrease = valDist > 0;

        // full travel from defMin to defMax takes defDuration
        // So: How much time shall we use? = Which share of the full duration do we need?
        // And: When will we be done?
        // timeTo = std::abs(valDist/defDist) * defDuration + timeFrom;
        timeFrom = std::isnan(_startTS) ? currCycle.simTime : _startTS;
        timeTo = fma(std::abs(valDist/defDist), defDuration, timeFrom);
    }
}